

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSerialPort.cpp
# Opt level: O1

ssize_t __thiscall PosixSerialPort::read(PosixSerialPort *this,int __fd,void *__buf,size_t __nbytes)

{
  uint __fd_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int iVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  timeval tv;
  fd_set fds;
  timeval local_c8;
  fd_set local_b8;
  
  if (this->_devfd == -1) {
LAB_0010ff70:
    uVar6 = 0xffffffff;
  }
  else {
    iVar5 = (int)__buf;
    if (iVar5 < 1) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      do {
        local_b8.fds_bits[0xe] = 0;
        local_b8.fds_bits[0xf] = 0;
        local_b8.fds_bits[0xc] = 0;
        local_b8.fds_bits[0xd] = 0;
        local_b8.fds_bits[10] = 0;
        local_b8.fds_bits[0xb] = 0;
        local_b8.fds_bits[8] = 0;
        local_b8.fds_bits[9] = 0;
        local_b8.fds_bits[6] = 0;
        local_b8.fds_bits[7] = 0;
        local_b8.fds_bits[4] = 0;
        local_b8.fds_bits[5] = 0;
        local_b8.fds_bits[2] = 0;
        local_b8.fds_bits[3] = 0;
        local_b8.fds_bits[0] = 0;
        local_b8.fds_bits[1] = 0;
        iVar2 = this->_devfd;
        iVar1 = iVar2 + 0x3f;
        if (-1 < iVar2) {
          iVar1 = iVar2;
        }
        local_b8.fds_bits[iVar1 >> 6] = local_b8.fds_bits[iVar1 >> 6] | 1L << ((byte)iVar2 & 0x3f);
        local_c8.tv_sec = (__time_t)(this->_timeout / 1000);
        local_c8.tv_usec = (__suseconds_t)((this->_timeout % 1000) * 1000);
        iVar2 = select(iVar2 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
        if (iVar2 < 0) goto LAB_0010ff70;
        if (iVar2 == 0) break;
        __fd_00 = this->_devfd;
        uVar3 = __fd_00 + 0x3f;
        if (-1 < (int)__fd_00) {
          uVar3 = __fd_00;
        }
        if (((ulong)local_b8.fds_bits[(int)uVar3 >> 6] >> ((ulong)__fd_00 & 0x3f) & 1) != 0) {
          sVar4 = ::read(__fd_00,(void *)((ulong)uVar6 + CONCAT44(in_register_00000034,__fd)),
                         (long)(int)(iVar5 - uVar6));
          if ((int)sVar4 < 0) goto LAB_0010ff70;
          uVar6 = uVar6 + (int)sVar4;
        }
      } while ((int)uVar6 < iVar5);
    }
  }
  return (ulong)uVar6;
}

Assistant:

int
PosixSerialPort::read(uint8_t* buffer, int len)
{
    fd_set fds;
    struct timeval tv;
    int numread = 0;
    int retval;

    if (_devfd == -1)
        return -1;

    while (numread < len)
    {
        FD_ZERO(&fds);
        FD_SET(_devfd, &fds);

        tv.tv_sec  = _timeout / 1000;
        tv.tv_usec = (_timeout % 1000) * 1000;

        retval = select(_devfd + 1, &fds, NULL, NULL, &tv);

        if (retval < 0)
        {
            return -1;
        }
        else if (retval == 0)
        {
            return numread;
        }
        else if (FD_ISSET(_devfd, &fds))
        {
            retval = ::read(_devfd, (uint8_t*) buffer + numread, len - numread);
            if (retval < 0)
                return -1;
            numread += retval;
        }
    }

    return numread;
}